

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

shared_ptr<inja::ExpressionNode> __thiscall
inja::Parser::parse_expression(Parser *this,Template *tmpl)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
  *this_00;
  ulong uVar1;
  size_t sVar2;
  size_t __n;
  _Base_ptr p_Var3;
  long lVar4;
  char *pcVar5;
  undefined1 auVar6 [8];
  Parser *pPVar7;
  int iVar8;
  LexerConfig *pLVar9;
  BlockNode *pBVar10;
  long *plVar11;
  ParserError *pPVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ParserConfig *pPVar14;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Op operation;
  size_type __rlen;
  Parser *this_01;
  shared_ptr<inja::ExpressionNode> sVar15;
  SourceLocation SVar16;
  string_view name;
  shared_ptr<inja::FunctionNode> function_node;
  shared_ptr<inja::ExpressionNode> expr_1;
  Arguments arguments;
  shared_ptr<inja::ExpressionNode> *expr;
  OperatorStack operator_stack;
  undefined1 local_170 [8];
  undefined1 auStack_168 [32];
  size_t local_148;
  size_t local_140;
  Lexer *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long local_110;
  undefined1 local_108 [24];
  basic_string_view<char,_std::char_traits<char>_> *local_f0;
  _Base_ptr *local_e8;
  BlockNode *local_e0;
  string local_d8;
  Arguments local_b8;
  Parser *local_98;
  Parser *local_90;
  _Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
  local_88;
  
  local_b8.
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_110 = in_RDX;
  local_98 = this;
  std::
  _Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
  ::_M_initialize_map(&local_88,0);
  this_00 = &tmpl->block_storage;
  local_138 = (Lexer *)&(tmpl->root).super_AstNode.pos;
  local_e8 = &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0 = (basic_string_view<char,_std::char_traits<char>_> *)
             &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header;
  local_e0 = (BlockNode *)&tmpl[1].root.super_AstNode.pos;
  local_140 = 0;
  local_148 = 0;
  this_01 = (Parser *)tmpl;
  local_90 = (Parser *)tmpl;
  do {
    pPVar7 = local_98;
    switch(*(undefined4 *)&(this_00->_M_t)._M_impl) {
    case 9:
      if (this_01->have_peek_tok == false) {
        Lexer::scan((Token *)local_170,local_138);
        local_e8[2] = (_Base_ptr)auStack_168._8_8_;
        *local_e8 = (_Base_ptr)local_170;
        local_e8[1] = (_Base_ptr)auStack_168._0_8_;
        this_01->have_peek_tok = true;
      }
      __n = (this_01->tok).text._M_len;
      uVar1 = __n - 2;
      if (uVar1 < 4) {
        local_108._16_8_ = (this_01->tok).text._M_str;
        switch(uVar1) {
        case 1:
switchD_00167fa5_caseD_1:
          iVar8 = bcmp((void *)local_108._16_8_,"and",__n);
          if (iVar8 == 0) goto switchD_00167d71_caseD_c;
          if (__n != 3) {
            if (__n != 2) goto switchD_00168467_default;
            break;
          }
          goto LAB_00168523;
        case 2:
          iVar8 = bcmp((void *)local_108._16_8_,"true",__n);
          if (iVar8 == 0) goto LAB_0016865e;
          switch(uVar1) {
          case 0:
            break;
          case 1:
            goto switchD_00167fa5_caseD_1;
          case 2:
switchD_00168467_caseD_2:
            iVar8 = bcmp((void *)local_108._16_8_,"null",__n);
            if (iVar8 == 0) goto LAB_0016865e;
            if (__n != 2) {
              if (__n != 3) goto switchD_00168467_default;
              goto switchD_00167fa5_caseD_1;
            }
            break;
          case 3:
            goto switchD_00167fa5_caseD_3;
          default:
            goto switchD_00168467_default;
          }
          break;
        case 3:
switchD_00167fa5_caseD_3:
          iVar8 = bcmp((void *)local_108._16_8_,"false",__n);
          if (iVar8 == 0) {
LAB_0016865e:
            if (local_140 == 0 && local_148 == 0) {
              p_Var3 = (_Base_ptr)local_f0->_M_str;
              (local_e0->super_AstNode)._vptr_AstNode = *(_func_int ***)&local_f0->_M_len;
              (local_e0->super_AstNode).pos = (size_t)p_Var3;
              auStack_168._0_8_ = (this_01->literal_start)._M_str;
              local_170 = (undefined1  [8])((char *)(local_108._16_8_ + __n) + -auStack_168._0_8_);
              local_d8._M_dataplus._M_p = (pointer)(auStack_168._0_8_ - *(long *)(local_110 + 0x28))
              ;
              local_130._M_dataplus._M_p = (pointer)0x0;
              ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<inja::LiteralNode,std::allocator<inja::LiteralNode>,std::basic_string_view<char,std::char_traits<char>>const&,long>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length,
                         (LiteralNode **)&local_130,(allocator<inja::LiteralNode> *)local_108,
                         (basic_string_view<char,_std::char_traits<char>_> *)local_170,
                         (long *)&local_d8);
              ::std::
              vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
              ::emplace_back<std::shared_ptr<inja::LiteralNode>>
                        ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                          *)&local_b8,(shared_ptr<inja::LiteralNode> *)&local_130);
              goto LAB_001681cc;
            }
            goto LAB_00168377;
          }
          if (__n != 2) {
            if (__n != 3) {
              if (__n == 4) goto switchD_00168467_caseD_2;
              goto switchD_00168467_default;
            }
            goto switchD_00167fa5_caseD_1;
          }
        }
        iVar8 = bcmp((void *)local_108._16_8_,"or",__n);
        if (iVar8 != 0) {
          if (__n == 3) {
LAB_00168523:
            iVar8 = bcmp((void *)local_108._16_8_,"not",__n);
          }
          else {
            if (__n != 2) goto switchD_00168467_default;
            iVar8 = bcmp((void *)local_108._16_8_,"in",2);
          }
          if (iVar8 != 0) goto switchD_00168467_default;
        }
        goto switchD_00167d71_caseD_c;
      }
switchD_00168467_default:
      if (*(int *)local_e8 == 0x15) {
        local_170 = (undefined1  [8])((this_01->tok).text._M_str + -*(long *)(local_110 + 0x28));
        local_108._0_8_ = (FunctionNode *)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::FunctionNode,std::allocator<inja::FunctionNode>,std::basic_string_view<char,std::char_traits<char>>&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                   (FunctionNode **)local_108,(allocator<inja::FunctionNode> *)&local_130,local_f0,
                   (long *)local_170);
        if (this_01->have_peek_tok == true) {
          (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_e8[2]
          ;
          p_Var3 = local_e8[1];
          *(_Base_ptr *)&(this_00->_M_t)._M_impl = *local_e8;
          *(_Base_ptr *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var3
          ;
          this_01->have_peek_tok = false;
        }
        else {
          Lexer::scan((Token *)local_170,local_138);
          (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)auStack_168._8_8_;
          *(undefined1 (*) [8])&(this_00->_M_t)._M_impl = local_170;
          *(undefined8 *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header =
               auStack_168._0_8_;
        }
        do {
          if (this_01->have_peek_tok == true) {
            (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 local_e8[2];
            p_Var3 = local_e8[1];
            *(_Base_ptr *)&(this_00->_M_t)._M_impl = *local_e8;
            *(_Base_ptr *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header =
                 p_Var3;
            this_01->have_peek_tok = false;
          }
          else {
            Lexer::scan((Token *)local_170,local_138);
            (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)auStack_168._8_8_;
            *(undefined1 (*) [8])&(this_00->_M_t)._M_impl = local_170;
            *(undefined8 *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header =
                 auStack_168._0_8_;
          }
          parse_expression((Parser *)local_170,(Template *)this_01);
          auVar6 = local_170;
          if (local_170 != (undefined1  [8])0x0) {
            *(int *)(local_108._0_8_ + 0x40) = *(int *)(local_108._0_8_ + 0x40) + 1;
            ::std::
            vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
            ::emplace_back<std::shared_ptr<inja::ExpressionNode>&>
                      ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                        *)(local_108._0_8_ + 0x48),(shared_ptr<inja::ExpressionNode> *)local_170);
          }
          if ((LexerConfig *)auStack_168._0_8_ != (LexerConfig *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_168._0_8_);
          }
          iVar8 = *(int *)&(this_00->_M_t)._M_impl;
        } while ((auVar6 != (undefined1  [8])0x0) && (iVar8 == 0x12));
        if (iVar8 != 0x16) {
          Token::describe_abi_cxx11_(&local_d8,(Token *)this_00);
          plVar11 = (long *)::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x185878)
          ;
          local_130._M_dataplus._M_p = (pointer)*plVar11;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p == paVar13) {
            local_130.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_130.field_2._8_8_ = plVar11[3];
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          }
          else {
            local_130.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_130._M_string_length = plVar11[1];
          *plVar11 = (long)paVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)::std::__cxx11::string::append((char *)&local_130);
          local_170 = (undefined1  [8])*plVar11;
          pPVar14 = (ParserConfig *)(plVar11 + 2);
          if (local_170 == (undefined1  [8])pPVar14) {
            auStack_168._8_8_ = *(undefined8 *)pPVar14;
            auStack_168._16_4_ = (undefined4)plVar11[3];
            auStack_168._20_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
            local_170 = (undefined1  [8])(auStack_168 + 8);
          }
          else {
            auStack_168._8_8_ = *(undefined8 *)pPVar14;
          }
          auStack_168._0_8_ = plVar11[1];
          *plVar11 = (long)pPVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          pPVar12 = (ParserError *)__cxa_allocate_exception(0x60);
          SVar16 = Lexer::current_position(local_138);
          ParserError::ParserError(pPVar12,(string *)local_170,SVar16);
          __cxa_throw(pPVar12,&ParserError::typeinfo,InjaError::~InjaError);
        }
        name._M_str = (((string *)(local_108._0_8_ + 0x20))->_M_dataplus)._M_p;
        name._M_len = ((string *)(local_108._0_8_ + 0x20))->_M_string_length;
        FunctionStorage::find_function
                  ((FunctionData *)local_170,this_01->function_storage,name,
                   *(int *)(local_108._0_8_ + 0x40));
        if (local_170._0_4_ == 0x2f) {
          ::std::operator+(&local_130,"unknown function ",(string *)(local_108._0_8_ + 0x20));
          pPVar12 = (ParserError *)__cxa_allocate_exception(0x60);
          SVar16 = Lexer::current_position(local_138);
          ParserError::ParserError(pPVar12,&local_130,SVar16);
          __cxa_throw(pPVar12,&ParserError::typeinfo,InjaError::~InjaError);
        }
        *(undefined4 *)(local_108._0_8_ + 0x18) = local_170._0_4_;
        if (local_170._0_4_ == 0x2e) {
          std::
          function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
          ::operator=((CallbackFunction *)(local_108._0_8_ + 0x60),
                      (function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
                       *)auStack_168);
        }
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::FunctionNode>&>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,(shared_ptr<inja::FunctionNode> *)local_108);
        pLVar9 = (LexerConfig *)local_108._8_8_;
        if ((code *)CONCAT44(auStack_168._20_4_,auStack_168._16_4_) != (code *)0x0) {
          (*(code *)CONCAT44(auStack_168._20_4_,auStack_168._16_4_))(auStack_168,auStack_168,3);
          pLVar9 = (LexerConfig *)local_108._8_8_;
        }
        goto LAB_0016836d;
      }
      pcVar5 = (this_01->tok).text._M_str;
      local_170 = (undefined1  [8])(auStack_168 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_170,pcVar5,pcVar5 + __n);
      local_d8._M_dataplus._M_p = (this_01->tok).text._M_str + -*(long *)(local_110 + 0x28);
      local_130._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<inja::DataNode,std::allocator<inja::DataNode>,std::__cxx11::string,long>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length,
                 (DataNode **)&local_130,(allocator<inja::DataNode> *)local_108,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                 (long *)&local_d8);
      ::std::
      vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
      ::emplace_back<std::shared_ptr<inja::DataNode>>
                ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                  *)&local_b8,(shared_ptr<inja::DataNode> *)&local_130);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length);
      }
      if (local_170 != (undefined1  [8])(auStack_168 + 8)) {
        operator_delete((void *)local_170,(ulong)(auStack_168._8_8_ + 1));
      }
      break;
    case 10:
      if (local_140 == 0 && local_148 == 0) {
        p_Var3 = (_Base_ptr)local_f0->_M_str;
        (local_e0->super_AstNode)._vptr_AstNode = *(_func_int ***)&local_f0->_M_len;
        (local_e0->super_AstNode).pos = (size_t)p_Var3;
        auStack_168._0_8_ = (this_01->literal_start)._M_str;
        local_170 = (undefined1  [8])
                    ((this_01->tok).text._M_str + ((this_01->tok).text._M_len - auStack_168._0_8_));
        local_d8._M_dataplus._M_p = (pointer)(auStack_168._0_8_ - *(long *)(local_110 + 0x28));
        local_130._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::LiteralNode,std::allocator<inja::LiteralNode>,std::basic_string_view<char,std::char_traits<char>>const&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length,
                   (LiteralNode **)&local_130,(allocator<inja::LiteralNode> *)local_108,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_170,(long *)&local_d8);
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::LiteralNode>>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,(shared_ptr<inja::LiteralNode> *)&local_130);
LAB_001681cc:
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length);
        }
        local_140 = 0;
        local_148 = 0;
      }
      break;
    case 0xb:
      if (local_140 == 0 && local_148 == 0) {
        p_Var3 = (_Base_ptr)local_f0->_M_str;
        (local_e0->super_AstNode)._vptr_AstNode = *(_func_int ***)&local_f0->_M_len;
        (local_e0->super_AstNode).pos = (size_t)p_Var3;
        auStack_168._0_8_ = (this_01->literal_start)._M_str;
        local_170 = (undefined1  [8])
                    ((this_01->tok).text._M_str + ((this_01->tok).text._M_len - auStack_168._0_8_));
        local_d8._M_dataplus._M_p = (pointer)(auStack_168._0_8_ - *(long *)(local_110 + 0x28));
        local_130._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::LiteralNode,std::allocator<inja::LiteralNode>,std::basic_string_view<char,std::char_traits<char>>const&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length,
                   (LiteralNode **)&local_130,(allocator<inja::LiteralNode> *)local_108,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_170,(long *)&local_d8);
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::LiteralNode>>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,(shared_ptr<inja::LiteralNode> *)&local_130);
        goto LAB_001681cc;
      }
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x13:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
switchD_00167d71_caseD_c:
      switch(*(undefined4 *)&(this_00->_M_t)._M_impl) {
      case 9:
        sVar2 = (this_01->tok).text._M_len;
        pcVar5 = (this_01->tok).text._M_str;
        if (sVar2 == 2) {
          iVar8 = bcmp(pcVar5,"or",2);
          if (iVar8 == 0) {
            operation = Or;
          }
          else {
            iVar8 = bcmp(pcVar5,"in",2);
            if (iVar8 != 0) goto LAB_001688ee;
            operation = In;
          }
        }
        else {
          if (sVar2 != 3) {
LAB_001688ee:
            local_170 = (undefined1  [8])(auStack_168 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_170,"unknown operator in parser.","");
            pPVar12 = (ParserError *)__cxa_allocate_exception(0x60);
            SVar16 = Lexer::current_position(local_138);
            ParserError::ParserError(pPVar12,(string *)local_170,SVar16);
            __cxa_throw(pPVar12,&ParserError::typeinfo,InjaError::~InjaError);
          }
          iVar8 = bcmp(pcVar5,"and",3);
          if (iVar8 == 0) {
            operation = And;
          }
          else {
            iVar8 = bcmp(pcVar5,"not",3);
            operation = Not;
            if (iVar8 != 0) goto LAB_001688ee;
          }
        }
        break;
      default:
        local_170 = (undefined1  [8])(auStack_168 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"unknown operator in parser.","");
        pPVar12 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar16 = Lexer::current_position(local_138);
        ParserError::ParserError(pPVar12,(string *)local_170,SVar16);
        __cxa_throw(pPVar12,&ParserError::typeinfo,InjaError::~InjaError);
      case 0xc:
        operation = Add;
        break;
      case 0xd:
        operation = Subtract;
        break;
      case 0xe:
        operation = Multiplication;
        break;
      case 0xf:
        operation = Division;
        break;
      case 0x10:
        operation = Modulo;
        break;
      case 0x11:
        operation = Power;
        break;
      case 0x13:
        operation = AtId;
        break;
      case 0x1b:
        operation = Equal;
        break;
      case 0x1c:
        operation = NotEqual;
        break;
      case 0x1d:
        operation = Greater;
        break;
      case 0x1e:
        operation = GreaterEqual;
        break;
      case 0x1f:
        operation = Less;
        break;
      case 0x20:
        operation = LessEqual;
      }
      p_Var3 = (((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<inja::BlockStatementNode>_>_>_>
                  *)&local_90->tok)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      lVar4 = *(long *)(local_110 + 0x28);
      local_170 = (undefined1  [8])0x0;
      pLVar9 = (LexerConfig *)operator_new(0x90);
      (pLVar9->statement_open)._M_string_length = 0x100000001;
      (pLVar9->statement_open)._M_dataplus._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_001b1ba8;
      paVar13 = &(pLVar9->statement_open).field_2;
      FunctionNode::FunctionNode((FunctionNode *)paVar13,operation,(long)p_Var3 - lVar4);
      this_01 = local_90;
      local_170 = (undefined1  [8])paVar13;
      auStack_168._0_8_ = pLVar9;
      while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
        pBVar10 = (BlockNode *)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pBVar10 = (BlockNode *)
                    &((ForStatementNode *)
                     local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1])[5].condition.
                     root;
        }
        if (*(uint *)&pBVar10[-1].nodes.
                      super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish[1].
                      super___shared_ptr<inja::AstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr <=
            *(uint *)((long)local_170 + 0x10)) {
          pBVar10 = (BlockNode *)local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pBVar10 = (BlockNode *)
                      &((ForStatementNode *)
                       local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1])[5].condition.
                       root;
          }
          if ((*(uint *)&pBVar10[-1].nodes.
                         super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[1].
                         super___shared_ptr<inja::AstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               *(uint *)((long)local_170 + 0x10)) || (*(int *)((long)local_170 + 0x14) != 0)) break;
        }
        add_operator(this_01,&local_b8,(OperatorStack *)&local_88);
      }
      ::std::
      deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>
      ::emplace_back<std::shared_ptr<inja::FunctionNode>&>
                ((deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>
                  *)&local_88,(shared_ptr<inja::FunctionNode> *)local_170);
      pLVar9 = (LexerConfig *)auStack_168._0_8_;
      goto LAB_0016836d;
    case 0x12:
      if (local_140 == 0 && local_148 == 0) goto switchD_00167d71_caseD_16;
      break;
    case 0x14:
      if (local_140 == 0 && local_148 == 0) {
        local_170 = (undefined1  [8])(auStack_168 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"unexpected \':\'","")
        ;
        pPVar12 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar16 = Lexer::current_position(local_138);
        ParserError::ParserError(pPVar12,(string *)local_170,SVar16);
        __cxa_throw(pPVar12,&ParserError::typeinfo,InjaError::~InjaError);
      }
      break;
    case 0x15:
      if (this_01->have_peek_tok == true) {
        (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_e8[2];
        p_Var3 = local_e8[1];
        *(_Base_ptr *)&(this_00->_M_t)._M_impl = *local_e8;
        *(_Base_ptr *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var3;
        this_01->have_peek_tok = false;
      }
      else {
        Lexer::scan((Token *)local_170,local_138);
        (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)auStack_168._8_8_;
        *(undefined1 (*) [8])&(this_00->_M_t)._M_impl = local_170;
        *(undefined8 *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header =
             auStack_168._0_8_;
      }
      parse_expression((Parser *)local_108,(Template *)this_01);
      if (*(int *)&(this_00->_M_t)._M_impl != 0x16) {
        Token::describe_abi_cxx11_(&local_d8,(Token *)this_00);
        plVar11 = (long *)::std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,0x185878);
        local_130._M_dataplus._M_p = (pointer)*plVar11;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p == paVar13) {
          local_130.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_130.field_2._8_8_ = plVar11[3];
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        }
        else {
          local_130.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        }
        local_130._M_string_length = plVar11[1];
        *plVar11 = (long)paVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)::std::__cxx11::string::append((char *)&local_130);
        local_170 = (undefined1  [8])*plVar11;
        pPVar14 = (ParserConfig *)(plVar11 + 2);
        if (local_170 == (undefined1  [8])pPVar14) {
          auStack_168._8_8_ = *(undefined8 *)pPVar14;
          auStack_168._16_4_ = (undefined4)plVar11[3];
          auStack_168._20_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
          local_170 = (undefined1  [8])(auStack_168 + 8);
        }
        else {
          auStack_168._8_8_ = *(undefined8 *)pPVar14;
        }
        auStack_168._0_8_ = plVar11[1];
        *plVar11 = (long)pPVar14;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        pPVar12 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar16 = Lexer::current_position(local_138);
        ParserError::ParserError(pPVar12,(string *)local_170,SVar16);
        __cxa_throw(pPVar12,&ParserError::typeinfo,InjaError::~InjaError);
      }
      if ((FunctionNode *)local_108._0_8_ == (FunctionNode *)0x0) {
        local_170 = (undefined1  [8])(auStack_168 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"empty expression in parentheses","");
        pPVar12 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar16 = Lexer::current_position(local_138);
        ParserError::ParserError(pPVar12,(string *)local_170,SVar16);
        __cxa_throw(pPVar12,&ParserError::typeinfo,InjaError::~InjaError);
      }
      ::std::
      vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
      ::emplace_back<std::shared_ptr<inja::ExpressionNode>&>
                ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                  *)&local_b8,(shared_ptr<inja::ExpressionNode> *)local_108);
      pLVar9 = (LexerConfig *)local_108._8_8_;
LAB_0016836d:
      if (pLVar9 != (LexerConfig *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar9);
      }
      break;
    default:
switchD_00167d71_caseD_16:
      while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
        add_operator(this_01,&local_b8,(OperatorStack *)&local_88);
      }
      pPVar7->config = (ParserConfig *)0x0;
      (pPVar7->lexer).config = (LexerConfig *)0x0;
      if ((long)local_b8.
                super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_b8.
                super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x10) {
        pPVar7->config =
             (ParserConfig *)
             ((local_b8.
               super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pPVar7->lexer,
                   &((local_b8.
                      super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::_M_assign_aux<std::shared_ptr<inja::ExpressionNode>const*>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,0,0);
      }
      else if (0x10 < (ulong)((long)local_b8.
                                    super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_b8.
                                   super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) {
        local_170 = (undefined1  [8])(auStack_168 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_170,"malformed expression","");
        pPVar12 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar16 = Lexer::current_position(local_138);
        ParserError::ParserError(pPVar12,(string *)local_170,SVar16);
        __cxa_throw(pPVar12,&ParserError::typeinfo,InjaError::~InjaError);
      }
      std::
      deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
      ::~deque((deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                *)&local_88);
      std::
      vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
      ::~vector(&local_b8);
      sVar15.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = extraout_RDX._M_pi;
      sVar15.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pPVar7;
      return (shared_ptr<inja::ExpressionNode>)
             sVar15.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>;
    case 0x17:
      if (local_140 == 0 && local_148 == 0) {
        p_Var3 = (_Base_ptr)local_f0->_M_str;
        (local_e0->super_AstNode)._vptr_AstNode = *(_func_int ***)&local_f0->_M_len;
        (local_e0->super_AstNode).pos = (size_t)p_Var3;
      }
      local_148 = local_148 + 1;
      break;
    case 0x18:
      if (local_148 == 0) {
        local_170 = (undefined1  [8])(auStack_168 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"unexpected \']\'","")
        ;
        pPVar12 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar16 = Lexer::current_position(local_138);
        ParserError::ParserError(pPVar12,(string *)local_170,SVar16);
        __cxa_throw(pPVar12,&ParserError::typeinfo,InjaError::~InjaError);
      }
      local_148 = local_148 - 1;
      if (local_140 == 0 && local_148 == 0) {
        auStack_168._0_8_ = (this_01->literal_start)._M_str;
        local_170 = (undefined1  [8])
                    ((this_01->tok).text._M_str + ((this_01->tok).text._M_len - auStack_168._0_8_));
        local_d8._M_dataplus._M_p = (pointer)(auStack_168._0_8_ - *(long *)(local_110 + 0x28));
        local_130._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::LiteralNode,std::allocator<inja::LiteralNode>,std::basic_string_view<char,std::char_traits<char>>const&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length,
                   (LiteralNode **)&local_130,(allocator<inja::LiteralNode> *)local_108,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_170,(long *)&local_d8);
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::LiteralNode>>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,(shared_ptr<inja::LiteralNode> *)&local_130);
        goto LAB_001681cc;
      }
      break;
    case 0x19:
      if (local_140 == 0 && local_148 == 0) {
        p_Var3 = (_Base_ptr)local_f0->_M_str;
        (local_e0->super_AstNode)._vptr_AstNode = *(_func_int ***)&local_f0->_M_len;
        (local_e0->super_AstNode).pos = (size_t)p_Var3;
      }
      local_140 = local_140 + 1;
      break;
    case 0x1a:
      if (local_140 == 0) {
        local_170 = (undefined1  [8])(auStack_168 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"unexpected \'}\'","")
        ;
        pPVar12 = (ParserError *)__cxa_allocate_exception(0x60);
        SVar16 = Lexer::current_position(local_138);
        ParserError::ParserError(pPVar12,(string *)local_170,SVar16);
        __cxa_throw(pPVar12,&ParserError::typeinfo,InjaError::~InjaError);
      }
      local_140 = local_140 - 1;
      if (local_140 == 0 && local_148 == 0) {
        auStack_168._0_8_ = (this_01->literal_start)._M_str;
        local_170 = (undefined1  [8])
                    ((this_01->tok).text._M_str + ((this_01->tok).text._M_len - auStack_168._0_8_));
        local_d8._M_dataplus._M_p = (pointer)(auStack_168._0_8_ - *(long *)(local_110 + 0x28));
        local_130._M_dataplus._M_p = (pointer)0x0;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<inja::LiteralNode,std::allocator<inja::LiteralNode>,std::basic_string_view<char,std::char_traits<char>>const&,long>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130._M_string_length,
                   (LiteralNode **)&local_130,(allocator<inja::LiteralNode> *)local_108,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_170,(long *)&local_d8);
        ::std::
        vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
        ::emplace_back<std::shared_ptr<inja::LiteralNode>>
                  ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                    *)&local_b8,(shared_ptr<inja::LiteralNode> *)&local_130);
        goto LAB_001681cc;
      }
    }
LAB_00168377:
    if (this_01->have_peek_tok == true) {
      (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_e8[2];
      p_Var3 = local_e8[1];
      *(_Base_ptr *)&(this_00->_M_t)._M_impl = *local_e8;
      *(_Base_ptr *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header = p_Var3;
      this_01->have_peek_tok = false;
    }
    else {
      Lexer::scan((Token *)local_170,local_138);
      (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)auStack_168._8_8_;
      *(undefined1 (*) [8])&(this_00->_M_t)._M_impl = local_170;
      *(undefined8 *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header =
           auStack_168._0_8_;
    }
  } while( true );
}

Assistant:

std::shared_ptr<ExpressionNode> parse_expression(Template& tmpl) {
    size_t current_bracket_level {0};
    size_t current_brace_level {0};
    Arguments arguments;
    OperatorStack operator_stack;

    while (tok.kind != Token::Kind::Eof) {
      // Literals
      switch (tok.kind) {
      case Token::Kind::String: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::Number: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::LeftBracket: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
        }
        current_bracket_level += 1;
      } break;
      case Token::Kind::LeftBrace: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
        }
        current_brace_level += 1;
      } break;
      case Token::Kind::RightBracket: {
        if (current_bracket_level == 0) {
          throw_parser_error("unexpected ']'");
        }

        current_bracket_level -= 1;
        if (current_brace_level == 0 && current_bracket_level == 0) {
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::RightBrace: {
        if (current_brace_level == 0) {
          throw_parser_error("unexpected '}'");
        }

        current_brace_level -= 1;
        if (current_brace_level == 0 && current_bracket_level == 0) {
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::Id: {
        get_peek_token();

        // Data Literal
        if (tok.text == static_cast<decltype(tok.text)>("true") || tok.text == static_cast<decltype(tok.text)>("false") ||
            tok.text == static_cast<decltype(tok.text)>("null")) {
          if (current_brace_level == 0 && current_bracket_level == 0) {
            literal_start = tok.text;
            add_literal(arguments, tmpl.content.c_str());
          }

          // Operator
        } else if (tok.text == "and" || tok.text == "or" || tok.text == "in" || tok.text == "not") {
          goto parse_operator;

          // Functions
        } else if (peek_tok.kind == Token::Kind::LeftParen) {
          auto func = std::make_shared<FunctionNode>(tok.text, tok.text.data() - tmpl.content.c_str());
          get_next_token();
          do {
            get_next_token();
            auto expr = parse_expression(tmpl);
            if (!expr) {
              break;
            }
            func->number_args += 1;
            func->arguments.emplace_back(expr);
          } while (tok.kind == Token::Kind::Comma);
          if (tok.kind != Token::Kind::RightParen) {
            throw_parser_error("expected right parenthesis, got '" + tok.describe() + "'");
          }

          auto function_data = function_storage.find_function(func->name, func->number_args);
          if (function_data.operation == FunctionStorage::Operation::None) {
            throw_parser_error("unknown function " + func->name);
          }
          func->operation = function_data.operation;
          if (function_data.operation == FunctionStorage::Operation::Callback) {
            func->callback = function_data.callback;
          }
          arguments.emplace_back(func);

          // Variables
        } else {
          arguments.emplace_back(std::make_shared<DataNode>(static_cast<std::string>(tok.text), tok.text.data() - tmpl.content.c_str()));
        }

        // Operators
      } break;
      case Token::Kind::Equal:
      case Token::Kind::NotEqual:
      case Token::Kind::GreaterThan:
      case Token::Kind::GreaterEqual:
      case Token::Kind::LessThan:
      case Token::Kind::LessEqual:
      case Token::Kind::Plus:
      case Token::Kind::Minus:
      case Token::Kind::Times:
      case Token::Kind::Slash:
      case Token::Kind::Power:
      case Token::Kind::Percent:
      case Token::Kind::Dot: {

      parse_operator:
        FunctionStorage::Operation operation;
        switch (tok.kind) {
        case Token::Kind::Id: {
          if (tok.text == "and") {
            operation = FunctionStorage::Operation::And;
          } else if (tok.text == "or") {
            operation = FunctionStorage::Operation::Or;
          } else if (tok.text == "in") {
            operation = FunctionStorage::Operation::In;
          } else if (tok.text == "not") {
            operation = FunctionStorage::Operation::Not;
          } else {
            throw_parser_error("unknown operator in parser.");
          }
        } break;
        case Token::Kind::Equal: {
          operation = FunctionStorage::Operation::Equal;
        } break;
        case Token::Kind::NotEqual: {
          operation = FunctionStorage::Operation::NotEqual;
        } break;
        case Token::Kind::GreaterThan: {
          operation = FunctionStorage::Operation::Greater;
        } break;
        case Token::Kind::GreaterEqual: {
          operation = FunctionStorage::Operation::GreaterEqual;
        } break;
        case Token::Kind::LessThan: {
          operation = FunctionStorage::Operation::Less;
        } break;
        case Token::Kind::LessEqual: {
          operation = FunctionStorage::Operation::LessEqual;
        } break;
        case Token::Kind::Plus: {
          operation = FunctionStorage::Operation::Add;
        } break;
        case Token::Kind::Minus: {
          operation = FunctionStorage::Operation::Subtract;
        } break;
        case Token::Kind::Times: {
          operation = FunctionStorage::Operation::Multiplication;
        } break;
        case Token::Kind::Slash: {
          operation = FunctionStorage::Operation::Division;
        } break;
        case Token::Kind::Power: {
          operation = FunctionStorage::Operation::Power;
        } break;
        case Token::Kind::Percent: {
          operation = FunctionStorage::Operation::Modulo;
        } break;
        case Token::Kind::Dot: {
          operation = FunctionStorage::Operation::AtId;
        } break;
        default: {
          throw_parser_error("unknown operator in parser.");
        }
        }
        auto function_node = std::make_shared<FunctionNode>(operation, tok.text.data() - tmpl.content.c_str());

        while (!operator_stack.empty() &&
               ((operator_stack.top()->precedence > function_node->precedence) ||
                (operator_stack.top()->precedence == function_node->precedence && function_node->associativity == FunctionNode::Associativity::Left))) {
          add_operator(arguments, operator_stack);
        }

        operator_stack.emplace(function_node);
      } break;
      case Token::Kind::Comma: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          goto break_loop;
        }
      } break;
      case Token::Kind::Colon: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          throw_parser_error("unexpected ':'");
        }
      } break;
      case Token::Kind::LeftParen: {
        get_next_token();
        auto expr = parse_expression(tmpl);
        if (tok.kind != Token::Kind::RightParen) {
            throw_parser_error("expected right parenthesis, got '" + tok.describe() + "'");
        }
        if (!expr) {
          throw_parser_error("empty expression in parentheses");
        }
        arguments.emplace_back(expr);
      } break;
      default:
        goto break_loop;
      }

      get_next_token();
    }

  break_loop:
    while (!operator_stack.empty()) {
      add_operator(arguments, operator_stack);
    }

    std::shared_ptr<ExpressionNode> expr;
    if (arguments.size() == 1) {
      expr = arguments[0];
      arguments = {};
    } else if (arguments.size() > 1) {
      throw_parser_error("malformed expression");
    }
    return expr;
  }